

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.h
# Opt level: O1

pfq_ele * __thiscall CVmObjTadsInhQueue::alloc_ele(CVmObjTadsInhQueue *this)

{
  pfq_page *ppVar1;
  long lVar2;
  pfq_ele *ppVar3;
  pfq_ele *ppVar4;
  
  if (this->free_ == (pfq_ele *)0x0) {
    ppVar1 = (pfq_page *)malloc(0x4b8);
    ppVar1->nxt = this->alloc_;
    this->alloc_ = ppVar1;
    lVar2 = 0;
    ppVar3 = this->free_;
    ppVar4 = ppVar1->eles;
    do {
      ppVar4->nxt = ppVar3;
      lVar2 = lVar2 + -0x18;
      ppVar3 = ppVar4;
      ppVar4 = ppVar4 + 1;
    } while (lVar2 != -0x4b0);
    this->free_ = ppVar1->eles + 0x31;
  }
  ppVar3 = this->free_;
  this->free_ = ppVar3->nxt;
  return ppVar3;
}

Assistant:

pfq_ele *alloc_ele()
    {
        pfq_ele *ele;

        /* if we have nothing in the free list, allocate more elements */
        if (free_ == 0)
        {
            pfq_page *pg;
            size_t i;

            /* allocate another page */
            pg = (pfq_page *)t3malloc(sizeof(pfq_page));

            /* link it into our master page list */
            pg->nxt = alloc_;
            alloc_ = pg;

            /* link all of its elements into the free list */
            for (ele = pg->eles, i = sizeof(pg->eles)/sizeof(pg->eles[0]) ;
                 i != 0 ; --i, ++ele)
            {
                /* link this one into the free list */
                ele->nxt = free_;
                free_ = ele;
            }
        }

        /* take the next element off the free list */
        ele = free_;
        free_ = free_->nxt;

        /* return the element */
        return ele;
    }